

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

char * __thiscall
cmOutputConverter::GetRelativeRootPath(cmOutputConverter *this,RelativeRoot relroot)

{
  cmState *pcVar1;
  RelativeRoot relroot_local;
  cmOutputConverter *this_local;
  
  switch(relroot) {
  case HOME:
    pcVar1 = GetState(this);
    this_local = (cmOutputConverter *)cmState::GetSourceDirectory(pcVar1);
    break;
  case START:
    this_local = (cmOutputConverter *)
                 cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    break;
  case HOME_OUTPUT:
    pcVar1 = GetState(this);
    this_local = (cmOutputConverter *)cmState::GetBinaryDirectory(pcVar1);
    break;
  case START_OUTPUT:
    this_local = (cmOutputConverter *)
                 cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
    break;
  default:
    this_local = (cmOutputConverter *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmOutputConverter::GetRelativeRootPath(RelativeRoot relroot) const
{
  switch (relroot)
    {
    case HOME:         return this->GetState()->GetSourceDirectory();
    case START:        return this->StateSnapshot.GetCurrentSourceDirectory();
    case HOME_OUTPUT:  return this->GetState()->GetBinaryDirectory();
    case START_OUTPUT: return this->StateSnapshot.GetCurrentBinaryDirectory();
    default: break;
    }
  return 0;
}